

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::LoopConstraint::appendConstraintAxis
          (LoopConstraint *this,SpatialVector *constraintAxis,bool positionLevelConstraint,
          bool velocityLevelConstraint)

{
  byte bVar1;
  byte in_CL;
  byte bVar2;
  byte in_DL;
  vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *in_RSI;
  long in_RDI;
  double dVar3;
  uint i;
  bool in_stack_0000003f;
  vector<bool,_std::allocator<bool>_> *in_stack_00000040;
  uint uVar4;
  undefined2 in_stack_ffffffffffffffec;
  
  bVar2 = in_DL & 1;
  bVar1 = in_CL & 1;
  dVar3 = std::numeric_limits<double>::epsilon();
  *(double *)(in_RDI + 0xf0) = dVar3 * 10.0;
  for (uVar4 = 0; uVar4 < *(uint *)(in_RDI + 0x30); uVar4 = uVar4 + 1) {
  }
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::push_back
            (in_RSI,(value_type *)
                    CONCAT17(bVar2,CONCAT16(bVar1,CONCAT24(in_stack_ffffffffffffffec,uVar4))));
  std::vector<bool,_std::allocator<bool>_>::push_back(in_stack_00000040,in_stack_0000003f);
  std::vector<bool,_std::allocator<bool>_>::push_back(in_stack_00000040,in_stack_0000003f);
  *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + 1;
  return;
}

Assistant:

void LoopConstraint::
        appendConstraintAxis( const Math::SpatialVector &constraintAxis,
                              bool positionLevelConstraint,
                              bool velocityLevelConstraint)
{

  dblA = 10.0*std::numeric_limits<double>::epsilon();

  //Make sure the normal is valid
#ifndef RBDL_USE_CASADI_MATH
  assert( std::fabs(constraintAxis.norm()-1.) < dblA);
  for(unsigned int i=0; i<sizeOfConstraint;++i){
    assert(std::fabs(T[i].dot(constraintAxis)) <= dblA);
  }
#endif

  T.push_back(constraintAxis);
  positionConstraint.push_back(positionLevelConstraint);
  velocityConstraint.push_back(velocityLevelConstraint);
  sizeOfConstraint++;

  assert(sizeOfConstraint <= 6 && sizeOfConstraint > 0);
}